

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPredictorTIFFSubStream.cpp
# Opt level: O0

void __thiscall InputPredictorTIFFSubStream::DecodeBufferToColors(InputPredictorTIFFSubStream *this)

{
  byte local_21;
  ulong uStack_20;
  Byte j_1;
  LongBufferSizeType j;
  LongBufferSizeType i;
  InputPredictorTIFFSubStream *this_local;
  
  j = 0;
  if (this->mBitsPerComponent == '\b') {
    for (; j < this->mReadColorsCount; j = j + 1) {
      this->mReadColors[j] = (ushort)this->mRowBuffer[j];
    }
  }
  else if (this->mBitsPerComponent < 8) {
    for (; j < this->mReadColorsCount * (ulong)this->mBitsPerComponent >> 3; j = j + 1) {
      for (uStack_20 = 0;
          uStack_20 < (ulong)(long)(int)(8 / (ulong)(long)(int)(uint)this->mBitsPerComponent);
          uStack_20 = uStack_20 + 1) {
        this->mReadColors[(((j + 1) * 8) / (ulong)this->mBitsPerComponent - uStack_20) + -1] =
             (ushort)this->mRowBuffer[j] & this->mBitMask;
        this->mRowBuffer[j] =
             (Byte)((int)(uint)this->mRowBuffer[j] >> (this->mBitsPerComponent & 0x1f));
      }
    }
  }
  else {
    for (; j < this->mReadColorsCount; j = j + 1) {
      this->mReadColors[j] = 0;
      for (local_21 = 0; (uint)local_21 < this->mBitsPerComponent / 8; local_21 = local_21 + 1) {
        this->mReadColors[j] =
             (this->mReadColors[j] << (this->mBitsPerComponent & 0x1f)) +
             (ushort)this->mRowBuffer[(j * this->mBitsPerComponent >> 3) + (ulong)local_21];
      }
    }
  }
  for (j = this->mColors; j < this->mReadColorsCount; j = j + 1) {
    this->mReadColors[j] =
         this->mReadColors[j] + this->mReadColors[j - this->mColors] & this->mBitMask;
  }
  this->mReadColorsIndex = this->mReadColors;
  this->mIndexInColor = '\0';
  return;
}

Assistant:

void InputPredictorTIFFSubStream::DecodeBufferToColors()
{	
	//1. Split to colors. Use array of colors (should be columns * colors). Each time take BitsPerComponent of the buffer
	//2. Once you got the "colors", loop the array, setting values after diffs (use modulo of bit mask for "sign" computing)
	//3. Now you have the colors array. 
	LongBufferSizeType i = 0;

	// read the colors differences according to bits per component
	if(8 == mBitsPerComponent)
	{
		for(; i < mReadColorsCount;++i)
			mReadColors[i] = mRowBuffer[i];
	}
	else if(8 > mBitsPerComponent)
	{
		for(; i < (mReadColorsCount*mBitsPerComponent/8);++i)
		{
			for(LongBufferSizeType j=0; j < (LongBufferSizeType)(8/mBitsPerComponent); ++j)
			{
				mReadColors[(i+1)*8/mBitsPerComponent - j - 1] = mRowBuffer[i] & mBitMask;
				mRowBuffer[i] = mRowBuffer[i]>>mBitsPerComponent;
			}
		}
	}
	else // mBitesPerComponent > 8
	{
		for(; i < mReadColorsCount;++i)
		{
			mReadColors[i] = 0;
			for(Byte j=0;j<mBitsPerComponent/8;++j)
				mReadColors[i] = (mReadColors[i]<<mBitsPerComponent) + mRowBuffer[i*mBitsPerComponent/8 + j];
		}
	}

	// calculate color values according to diffs
	for(i = mColors; i < mReadColorsCount; ++i)
		mReadColors[i] = (mReadColors[i] + mReadColors[i-mColors]) & mBitMask;

	mReadColorsIndex = mReadColors;
	mIndexInColor = 0;

}